

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

string * __thiscall
google::protobuf::Reflection::GetString_abi_cxx11_
          (string *__return_storage_ptr__,Reflection *this,Message *message,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  byte bVar1;
  Descriptor *pDVar2;
  pointer pcVar3;
  void *pvVar4;
  long lVar5;
  bool bVar6;
  uint32_t uVar7;
  CppStringType CVar8;
  Cord **ppCVar9;
  string *psVar10;
  ArenaStringPtr *pAVar11;
  Cord *this_01;
  char *description;
  OneofDescriptor *oneof_descriptor;
  Metadata MVar12;
  
  MVar12 = Message::GetMetadata(message);
  if (MVar12.reflection != this) {
LAB_002580ab:
    pDVar2 = this->descriptor_;
    MVar12 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar2,MVar12.descriptor,field,"GetString");
  }
  pDVar2 = this->descriptor_;
  if (field->containing_type_ != pDVar2) {
    description = "Field does not match message type.";
LAB_002580ea:
    anon_unknown_6::ReportReflectionUsageError(pDVar2,field,"GetString",description);
  }
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
    GetString_abi_cxx11_();
    goto LAB_002580ab;
  }
  if ((bVar1 & 0x20) != 0) {
    description = "Field is repeated; the method requires a singular field.";
    goto LAB_002580ea;
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
    anon_unknown_6::ReportReflectionUsageTypeError(pDVar2,field,"GetString",CPPTYPE_STRING);
  }
  this_00 = &this->schema_;
  if ((bVar1 & 8) == 0) {
    bVar6 = internal::ReflectionSchema::InRealOneof(this_00,field);
    if (bVar6) {
      if ((field->field_0x1 & 0x10) == 0) {
        oneof_descriptor = (OneofDescriptor *)0x0;
      }
      else {
        oneof_descriptor = (field->scope_).containing_oneof;
        if (oneof_descriptor == (OneofDescriptor *)0x0) goto LAB_0025810b;
      }
      uVar7 = GetOneofCase(this,message,oneof_descriptor);
      if (uVar7 != field->number_) goto LAB_00258061;
    }
    CVar8 = FieldDescriptor::cpp_string_type(field);
    if ((CVar8 != kView) && (CVar8 != kString)) {
      if (CVar8 == kCord) {
        bVar6 = internal::ReflectionSchema::InRealOneof(this_00,field);
        if (bVar6) {
          ppCVar9 = GetRaw<absl::lts_20250127::Cord*>(this,message,field);
          this_01 = *ppCVar9;
        }
        else {
          this_01 = GetRaw<absl::lts_20250127::Cord>(this,message,field);
        }
        absl::lts_20250127::Cord::operator_cast_to_string(__return_storage_ptr__,this_01);
        return __return_storage_ptr__;
      }
      GetString_abi_cxx11_();
LAB_0025810b:
      internal::protobuf_assumption_failed
                ("res != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb31);
    }
    bVar6 = internal::ReflectionSchema::IsFieldInlined(this_00,field);
    if (bVar6) {
      psVar10 = (string *)GetRaw<google::protobuf::internal::InlinedStringField>(this,message,field)
      ;
    }
    else {
      pAVar11 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
      pvVar4 = (pAVar11->tagged_ptr_).ptr_;
      if (((ulong)pvVar4 & 3) == 0) {
LAB_00258061:
        lVar5 = *(long *)(field->field_20).default_value_enum_;
        psVar10 = ((field->field_20).default_value_enum_)->all_names_;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,lVar5,(long)&(psVar10->_M_dataplus)._M_p + lVar5
                  );
        return __return_storage_ptr__;
      }
      psVar10 = (string *)((ulong)pvVar4 & 0xfffffffffffffffc);
    }
  }
  else {
    uVar7 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
    psVar10 = internal::ExtensionSet::GetString
                        ((ExtensionSet *)
                         ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7),
                         field->number_,(field->field_20).default_value_string_);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (psVar10->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar3,pcVar3 + psVar10->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string Reflection::GetString(const Message& message,
                                  const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(
        field->number(), internal::DefaultValueStringAsString(field));
  } else {
    if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
      return std::string(field->default_value_string());
    }
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        if (schema_.InRealOneof(field)) {
          return std::string(*GetField<absl::Cord*>(message, field));
        } else {
          return std::string(GetField<absl::Cord>(message, field));
        }
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        if (IsInlined(field)) {
          return GetField<InlinedStringField>(message, field).GetNoArena();
        } else if (IsMicroString(field)) {
          return std::string(GetField<MicroString>(message, field).Get());
        } else {
          const auto& str = GetField<ArenaStringPtr>(message, field);
          return str.IsDefault() ? std::string(field->default_value_string())
                                 : str.Get();
        }
    }
    internal::Unreachable();
  }
}